

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O2

ByteData * __thiscall
cfd::core::ScriptElement::GetData(ByteData *__return_storage_ptr__,ScriptElement *this)

{
  ScriptType SVar1;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> byte_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> byte_array;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (this->type_ == kElementNumber) {
    SerializeScriptNum((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40,
                       this->value_);
    WallyUtil::CreateScriptDataFromBytes
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_28,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40,0);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58,&local_28);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_28);
    this_00 = &local_40;
  }
  else {
    if (this->type_ != kElementBinary) {
      SVar1 = (this->op_code_).data_type_;
      if (SVar1 != kOpInvalidOpCode) {
        local_40._M_impl.super__Vector_impl_data._M_start._0_1_ = (undefined1)SVar1;
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58,
                   (uchar *)&local_40);
      }
      goto LAB_003568d0;
    }
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_28,
                       &this->binary_data_);
    WallyUtil::CreateScriptDataFromBytes
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_28,0);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58,&local_40);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_40);
    this_00 = &local_28;
  }
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(this_00);
LAB_003568d0:
  ByteData::ByteData(__return_storage_ptr__,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_58);
  return __return_storage_ptr__;
}

Assistant:

ByteData ScriptElement::GetData() const {
  std::vector<uint8_t> byte_data;
  switch (type_) {
    case kElementBinary: {
      byte_data =
          WallyUtil::CreateScriptDataFromBytes(binary_data_.GetBytes());
      break;
    }
    case kElementNumber: {
      std::vector<uint8_t> byte_array = SerializeScriptNum(value_);
      byte_data = WallyUtil::CreateScriptDataFromBytes(byte_array);
      break;
    }
    case kElementOpCode:
    default: {
      ScriptType op_code = op_code_.GetDataType();
      if (op_code != kOpInvalidOpCode) {
        byte_data.push_back(static_cast<uint8_t>(op_code));
      }
      break;
    }
  }
  return ByteData(byte_data);
}